

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O2

int zueci_ascii_inv_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  
  bVar1 = *src;
  if ((bVar1 != 0x7f && (flags & 1) == 0) &&
     ((0x7a < bVar1 ||
      (((bVar1 - 0x23 < 0x1e && ((0x20000003U >> (bVar1 - 0x23 & 0x1f) & 1) != 0)) ||
       (bVar1 != 0x5f && 0xf9 < (byte)(bVar1 + 0x9f))))))) {
    return 0;
  }
  *p_u = (uint)bVar1;
  return 1;
}

Assistant:

static int zueci_ascii_inv_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags,
            zueci_u32 *p_u) {
    const unsigned char c = *src;
    (void)len;
    if ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) || c == 0x7F || (c <= 'z' && c != '#' && c != '$' && c != '@'
            && (c <= 'Z' || c == '_' || c >= 'a'))) {
        *p_u = c;
        return 1;
    }
    return 0;
}